

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void ktx::validateToolInput(istream *stream,string *filepath,Reporter *report)

{
  int iVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    errnoMessage_abi_cxx11_();
    Reporter::fatal<char_const(&)[35],std::__cxx11::string_const&,std::__cxx11::string>
              (report,IO_FAILURE,(char (*) [35])"Could not open input file \"{}\": {}",filepath,
               &bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp:320:21)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp:320:21)>
             ::_M_manager;
  iVar1 = validateIOStream(stream,filepath,false,false,
                           (function<void_(const_ktx::ValidationReport_&)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  if (iVar1 == 0) {
    std::istream::seekg(stream,0,0);
    if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
      errnoMessage_abi_cxx11_();
      Reporter::fatal<char_const(&)[41],std::__cxx11::string_const&,std::__cxx11::string>
                (report,IO_FAILURE,(char (*) [41])"Could not rewind the input file \"{}\": {}",
                 filepath,&bStack_68);
      std::__cxx11::string::~string((string *)&bStack_68);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_00240758;
  *(int *)(puVar2 + 1) = iVar1;
  __cxa_throw(puVar2,&FatalError::typeinfo,std::exception::~exception);
}

Assistant:

void validateToolInput(std::istream& stream, const std::string& filepath, Reporter& report) {
    if (!stream)
        report.fatal(rc::IO_FAILURE, "Could not open input file \"{}\": {}", filepath, errnoMessage());

    auto callback = [&](const ValidationReport& issue) {
        fmt::print(std::cerr, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
        fmt::print(std::cerr, "    {}\n", issue.details);
    };
    const auto validationResult = validateIOStream(stream, filepath, false, false, callback);

    if (validationResult != +rc::SUCCESS)
        throw FatalError(ReturnCode{validationResult});

    stream.seekg(0);
    if (!stream)
        report.fatal(rc::IO_FAILURE, "Could not rewind the input file \"{}\": {}", filepath, errnoMessage());
}